

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O2

void sha1ni(void *key,int len,uint32_t seed,void *out)

{
  uint8_t *data;
  uint uVar1;
  uint length;
  uint32_t state [5];
  uint8_t padded [64];
  
  state[4] = 0xc3d2e1f0;
  state[2] = 0x98badcfe;
  state[3] = 0x10325476;
  state._0_8_ = CONCAT44(0xefcdab89,seed) ^ 0x67452301;
  if (len < 0x40) {
    memcpy(padded,key,(long)len);
    memset(padded + len,0,(ulong)(0x40 - len));
    key = padded;
    len = 0x40;
  }
  else if ((len & 0x3fU) != 0) {
    uVar1 = 0x40 - (len & 0x3fU);
    length = uVar1 + len;
    data = (uint8_t *)malloc((ulong)length);
    memcpy(data,key,(ulong)(uint)len);
    memset(data + (uint)len,0,(ulong)uVar1);
    sha1_process_x86(state,data,length);
    free(data);
    goto LAB_00109ece;
  }
  sha1_process_x86(state,(uint8_t *)key,len);
LAB_00109ece:
  *(uint32_t *)((long)out + 0x10) = state[4];
  *(undefined8 *)out = state._0_8_;
  *(undefined8 *)((long)out + 8) = state._8_8_;
  return;
}

Assistant:

inline void sha1ni(const void *key, int len, uint32_t seed, void *out)
{
  // objsize: 0x2c1 + this (0x408bac - 0x408a90) = 989
  uint32_t state[5] = {0x67452301, 0xefcdab89, 0x98badcfe, 0x10325476, 0xc3d2e1f0};
  state[0] = 0x67452301U ^ seed;
  if (len < 64) {
    uint8_t padded[64];
    memcpy (padded, key, len);
    memset (&padded[len], 0, 64-len);
    sha1_process_x86(state, (const uint8_t*)padded, 64);
  } else if (len % 64) {
    uint32_t lenpadded = len + (64 - len % 64);
    uint8_t *padded = (uint8_t*)malloc (lenpadded);
    memcpy (padded, key, len);
    memset (&padded[len], 0, lenpadded-len);
    sha1_process_x86(state, (const uint8_t*)padded, lenpadded);
    free (padded);
  } else {
    sha1_process_x86(state, (const uint8_t*)key, (uint32_t)len);
  }
  memcpy(out, state, 20);
}